

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keymacro.c
# Opt level: O2

wchar_t node__try(EditLine *el,keymacro_node_t *ptr,wchar_t *str,keymacro_value_t *val,wchar_t ntype
                 )

{
  wchar_t *pwVar1;
  wchar_t wVar2;
  int iVar3;
  EditLine *pEVar4;
  FILE_conflict *pFVar5;
  int iVar6;
  EditLine *pEVar7;
  keymacro_node_t *pkVar8;
  
  iVar6 = (int)val;
  pkVar8 = ptr;
LAB_00119f8d:
  wVar2 = *(wchar_t *)&el->el_prog;
  pEVar7 = el;
  while (wVar2 != pkVar8->ch) {
    pEVar4 = (EditLine *)pEVar7->el_errfile;
    if (pEVar4 == (EditLine *)0x0) {
      pEVar4 = (EditLine *)node__get(pkVar8->ch);
      pEVar7->el_errfile = (FILE_conflict *)pEVar4;
      pEVar7 = pEVar4;
      break;
    }
    pEVar7 = pEVar4;
    wVar2 = *(wchar_t *)&pEVar4->el_prog;
  }
  pwVar1 = &pkVar8->type;
  el = (EditLine *)pEVar7->el_outfile;
  if (*pwVar1 != L'\0') {
    pkVar8 = (keymacro_node_t *)&pkVar8->type;
    if (el == (EditLine *)0x0) {
      el = (EditLine *)node__get(*pwVar1);
      pEVar7->el_outfile = (FILE_conflict *)el;
    }
    goto LAB_00119f8d;
  }
  if (el != (EditLine *)0x0) {
    node__put(el,ptr);
    pEVar7->el_outfile = (FILE_conflict *)0x0;
  }
  iVar3 = *(int *)((long)&pEVar7->el_prog + 4);
  if ((iVar3 != 0) && (iVar3 != 2)) {
    if (iVar3 != 1) goto LAB_0011a033;
    free(pEVar7->el_infile);
  }
  *(int *)((long)&pEVar7->el_prog + 4) = iVar6;
  if (iVar6 == 1) {
    pFVar5 = (FILE_conflict *)wcsdup(*(wchar_t **)str);
  }
  else {
    if (iVar6 != 0) {
LAB_0011a033:
      abort();
    }
    pFVar5 = *(FILE_conflict **)str;
  }
  pEVar7->el_infile = pFVar5;
  return (wchar_t)pFVar5;
}

Assistant:

static int
node__try(EditLine *el, keymacro_node_t *ptr, const wchar_t *str,
    keymacro_value_t *val, int ntype)
{

	if (ptr->ch != *str) {
		keymacro_node_t *xm;

		for (xm = ptr; xm->sibling != NULL; xm = xm->sibling)
			if (xm->sibling->ch == *str)
				break;
		if (xm->sibling == NULL)
			xm->sibling = node__get(*str);	/* setup new node */
		ptr = xm->sibling;
	}
	if (*++str == '\0') {
		/* we're there */
		if (ptr->next != NULL) {
			node__put(el, ptr->next);
				/* lose longer keys with this prefix */
			ptr->next = NULL;
		}
		switch (ptr->type) {
		case XK_CMD:
		case XK_NOD:
			break;
		case XK_STR:
			if (ptr->val.str)
				el_free(ptr->val.str);
			break;
		default:
			EL_ABORT((el->el_errfile, "Bad XK_ type %d\n",
			    ptr->type));
			break;
		}

		switch (ptr->type = ntype) {
		case XK_CMD:
			ptr->val = *val;
			break;
		case XK_STR:
			if ((ptr->val.str = wcsdup(val->str)) == NULL)
				return -1;
			break;
		default:
			EL_ABORT((el->el_errfile, "Bad XK_ type %d\n", ntype));
			break;
		}
	} else {
		/* still more chars to go */
		if (ptr->next == NULL)
			ptr->next = node__get(*str);	/* setup new node */
		(void) node__try(el, ptr->next, str, val, ntype);
	}
	return 0;
}